

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid)

{
  REF_MPI pRVar1;
  REF_NODE ref_node_00;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  int local_70;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL need_to_keep;
  REF_INT node;
  REF_INT group;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->mpi;
  ref_node_00 = ref_grid->node;
  if (ref_grid->mpi->n < 2) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_migrate_shufflin_node(ref_node_00);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_migrate_shufflin_geom(ref_grid);
        if (ref_grid_local._4_4_ == 0) {
          need_to_keep = 0;
          _node = ref_grid->cell[0];
          while (need_to_keep < 0x10) {
            uVar3 = ref_migrate_shufflin_cell(ref_node_00,_node);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x6a4,"ref_migrate_shufflin",(ulong)uVar3,"cell");
              return uVar3;
            }
            need_to_keep = need_to_keep + 1;
            _node = ref_grid->cell[need_to_keep];
          }
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node_00->max;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            if (((-1 < ref_private_macro_code_rss) &&
                (ref_private_macro_code_rss < ref_node_00->max)) &&
               (-1 < ref_node_00->global[ref_private_macro_code_rss])) {
              if (pRVar1->id == ref_node_00->part[ref_private_macro_code_rss]) {
                uVar3 = ref_geom_remove_without_cell(ref_grid,ref_private_macro_code_rss);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x6ba,"ref_migrate_shufflin",(ulong)uVar3,
                         "rm local geom without cell support");
                  return uVar3;
                }
              }
              else {
                bVar4 = false;
                need_to_keep = 0;
                _node = ref_grid->cell[0];
                while (need_to_keep < 0x10) {
                  bVar2 = !bVar4;
                  bVar4 = true;
                  if (bVar2) {
                    if ((ref_private_macro_code_rss < 0) ||
                       (_node->ref_adj->nnode <= ref_private_macro_code_rss)) {
                      local_70 = -1;
                    }
                    else {
                      local_70 = _node->ref_adj->first[ref_private_macro_code_rss];
                    }
                    bVar4 = local_70 != -1;
                  }
                  need_to_keep = need_to_keep + 1;
                  _node = ref_grid->cell[need_to_keep];
                }
                if (bVar4) {
                  uVar3 = ref_geom_remove_without_cell(ref_grid,ref_private_macro_code_rss);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x6b0,"ref_migrate_shufflin",(ulong)uVar3,
                           "rm ghost geom without cell support");
                    return uVar3;
                  }
                }
                else {
                  uVar3 = ref_node_remove_without_global_invalidates_sorted
                                    (ref_node_00,ref_private_macro_code_rss);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x6b3,"ref_migrate_shufflin",(ulong)uVar3,"remove");
                    return uVar3;
                  }
                  uVar3 = ref_geom_remove_all(ref_grid->geom,ref_private_macro_code_rss);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x6b4,"ref_migrate_shufflin",(ulong)uVar3,"rm geom");
                    return uVar3;
                  }
                }
              }
            }
          }
          ref_grid_local._4_4_ = ref_node_rebuild_sorted_global(ref_node_00);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_node_ghost_real(ref_node_00);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_geom_ghost(ref_grid->geom,ref_node_00);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x6c0,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"ghost geom");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x6bf,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"ghost real");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x6bd,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"rebuild");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x6a2,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"geom");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x6a1,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"send out nodes");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x69f,"ref_migrate_shufflin",(ulong)ref_grid_local._4_4_,"sync global nodes");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group, node;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_grid_mpi(ref_grid))) return REF_SUCCESS;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  RSS(ref_migrate_shufflin_node(ref_node), "send out nodes");
  RSS(ref_migrate_shufflin_geom(ref_grid), "geom");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "cell");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      need_to_keep = REF_FALSE;
      each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
        need_to_keep =
            (need_to_keep || !ref_adj_empty(ref_cell_adj(ref_cell), node));
      }
      if (need_to_keep) {
        RSS(ref_geom_remove_without_cell(ref_grid, node),
            "rm ghost geom without cell support");
      } else {
        RSS(ref_node_remove_without_global_invalidates_sorted(ref_node, node),
            "remove");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm geom");
      }
    } else {
      /* not sure why this is needed,
       * geom on a ghost that was removed from local? */
      RSS(ref_geom_remove_without_cell(ref_grid, node),
          "rm local geom without cell support");
    }
  }
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  return REF_SUCCESS;
}